

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HPresolve.cpp
# Opt level: O3

void __thiscall HPresolve::setBasisElement(HPresolve *this,change c)

{
  iterator iVar1;
  _Map_pointer ppcVar2;
  change *pcVar3;
  change *pcVar4;
  pointer piVar5;
  ulong uVar6;
  ulong uVar7;
  int iStack_14;
  int local_10 [2];
  
  local_10[0] = c.col;
  if (0xd < (uint)c.type) {
    return;
  }
  iStack_14 = c.row;
  switch(c.type) {
  case 0:
  case 4:
  case 5:
    uVar6 = (long)iStack_14 + (long)(this->super_HPreData).numColOriginal;
    piVar5 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if (uVar6 < (ulong)((long)(this->super_HPreData).nonbasicFlag.
                              super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar5 >> 2)) {
      piVar5[uVar6] = 0;
      return;
    }
    break;
  case 1:
    ppcVar2 = *(_Map_pointer *)
               ((long)&(this->super_HPreData).chng.c.
                       super__Deque_base<change,_std::allocator<change>_>._M_impl.
                       super__Deque_impl_data._M_finish + 0x18);
    pcVar4 = (this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>.
             _M_impl.super__Deque_impl_data._M_finish._M_cur;
    pcVar3 = *(_Elt_pointer *)
              ((long)&(this->super_HPreData).chng.c.
                      super__Deque_base<change,_std::allocator<change>_>._M_impl.
                      super__Deque_impl_data._M_finish + 8);
    if (((long)pcVar4 - (long)pcVar3 >> 2) * -0x5555555555555555 +
        (((long)ppcVar2 -
          (long)*(_Map_pointer *)
                 ((long)&(this->super_HPreData).chng.c.
                         super__Deque_base<change,_std::allocator<change>_>._M_impl.
                         super__Deque_impl_data._M_start + 0x18) >> 3) + -1 +
        (ulong)(ppcVar2 == (_Map_pointer)0x0)) * 0x2a ==
        ((long)*(_Elt_pointer *)
                ((long)&(this->super_HPreData).chng.c.
                        super__Deque_base<change,_std::allocator<change>_>._M_impl.
                        super__Deque_impl_data._M_start + 0x10) -
         (long)(this->super_HPreData).chng.c.super__Deque_base<change,_std::allocator<change>_>.
               _M_impl.super__Deque_impl_data._M_start._M_cur >> 2) * 0x5555555555555555) {
      return;
    }
    if (pcVar4 == pcVar3) {
      pcVar4 = ppcVar2[-1] + 0x2a;
    }
    if (pcVar4[-1].type == 2) {
      return;
    }
  case 10:
  case 0xb:
  case 0xd:
    piVar5 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    if ((ulong)(long)local_10[0] <
        (ulong)((long)(this->super_HPreData).nonbasicFlag.
                      super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                      _M_finish - (long)piVar5 >> 2)) {
      piVar5[local_10[0]] = 1;
switchD_0014737f_caseD_2:
      return;
    }
    break;
  default:
    goto switchD_0014737f_caseD_2;
  case 7:
  case 9:
    piVar5 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    piVar5[local_10[0]] = 0;
    iVar1._M_current =
         (this->super_HPreData).basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->super_HPreData).basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&(this->super_HPreData).basicIndex,iVar1,
                 local_10);
      piVar5 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
    }
    else {
      *iVar1._M_current = local_10[0];
      (this->super_HPreData).basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    uVar7 = (long)iStack_14 + (long)(this->super_HPreData).numColOriginal;
    uVar6 = (long)(this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
    goto LAB_0014755a;
  case 8:
    piVar5 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
             _M_impl.super__Vector_impl_data._M_start;
    uVar6 = (long)(this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar5 >> 2;
    if (uVar6 <= (ulong)(long)local_10[0]) break;
    piVar5[local_10[0]] = 0;
    iVar1._M_current =
         (this->super_HPreData).basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (iVar1._M_current ==
        (this->super_HPreData).basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                ((vector<int,std::allocator<int>> *)&(this->super_HPreData).basicIndex,iVar1,
                 local_10);
      piVar5 = (this->super_HPreData).nonbasicFlag.super__Vector_base<int,_std::allocator<int>_>.
               _M_impl.super__Vector_impl_data._M_start;
      uVar6 = (long)(this->super_HPreData).nonbasicFlag.
                    super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                    _M_finish - (long)piVar5 >> 2;
    }
    else {
      *iVar1._M_current = local_10[0];
      (this->super_HPreData).basicIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_finish = iVar1._M_current + 1;
    }
    uVar7 = (long)iStack_14 + (long)(this->super_HPreData).numColOriginal;
LAB_0014755a:
    if (uVar7 < uVar6) {
      piVar5[uVar7] = 1;
      return;
    }
  }
  std::__throw_out_of_range_fmt
            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
}

Assistant:

void HPresolve::setBasisElement(change c) {

	//nonbasicFlag starts off as [numCol + numRow] and is already
	//increased to [numColOriginal + numRowOriginal] so fill in gaps

	switch (c.type) {
		case EMPTY_ROW: {
			nonbasicFlag.at(numColOriginal + c.row) = 0;
			break;
		}
		case SING_ROW: {
			//elsewhere
			break;
		}
		case FORCING_ROW_VARIABLE:
			// variables set at a bound by forcing row fRjs.p
			// all nonbasic

			break;
		case FORCING_ROW: {
			nonbasicFlag.at(numColOriginal + c.row) = 0;
			break;
		}
		case REDUNDANT_ROW: {
			nonbasicFlag.at(numColOriginal + c.row) = 0;
			break;
		}
		case FREE_SING_COL:
		case IMPLIED_FREE_SING_COL: {
			nonbasicFlag[c.col] = 0;
			basicIndex.push_back(c.col);

			nonbasicFlag.at(numColOriginal + c.row) = 1;
			break;
		}
		case SING_COL_DOUBLETON_INEQ: {
			// column singleton in a doubleton inequality.
			nonbasicFlag.at(c.col) = 0;
			basicIndex.push_back(c.col);

			nonbasicFlag.at(numColOriginal + c.row) = 1;
			break;
		}
		case EMPTY_COL:
		case DOMINATED_COLS:
		case WEAKLY_DOMINATED_COLS: {
			nonbasicFlag.at(c.col) = 1;
			break;
		}
		case FIXED_COL: { //fixed variable:
			//check if it was NOT after singRow
			if (chng.size() > 0)
				if (chng.top().type != SING_ROW)
					nonbasicFlag.at(c.col) = 1;
			break;
		}

	}

}